

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

size_t __thiscall
(anonymous_namespace)::ExprHasher::
VisitBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
          (ExprHasher *this,
          BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
          e)

{
  ExprBase value;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  *this_00;
  size_t sVar1;
  ExprBase in_RSI;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_ffffffffffffffd8;
  
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            (in_stack_ffffffffffffffd8,
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )in_RSI.impl_,(type_conflict)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  value.impl_ = (Impl *)mp::
                        BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                        ::lhs(in_stack_ffffffffffffffc8);
  this_00 = (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
             *)Hash<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                         ((Expr)in_RSI.impl_,
                          (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)value.impl_);
  mp::
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  ::rhs(this_00);
  sVar1 = HashCombine<(mp::expr::Kind)1,(mp::expr::Kind)47>
                    ((size_t)value.impl_,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_RSI.impl_);
  return sVar1;
}

Assistant:

size_t VisitBinary(E e) { return HashCombine(Hash(e, e.lhs()), e.rhs()); }